

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O2

char * path_append(char *buf,char *path,char *add,size_t bufsize)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = strlen(path);
  sVar2 = strlen(add);
  if (sVar2 + sVar1 + 1 < bufsize) {
    if (buf != path) {
      strcpy(buf,path);
    }
    if (sVar1 == 0) {
      sVar1 = 0;
    }
    else if (buf[sVar1 - 1] != '/') {
      buf[sVar1] = '/';
      sVar1 = sVar1 + 1;
    }
    strcpy(buf + sVar1,add);
  }
  else {
    buf = (char *)0x0;
  }
  return buf;
}

Assistant:

char *path_append(char *buf,const char *path,const char *add,size_t bufsize)
/* append a file- or path-name to an existing path and convert */
{
  size_t len = strlen(path);
#if defined(AMIGAOS) || defined(_WIN32)
  char *p;
#endif

  if ((len+strlen(add)+1) < bufsize) {
    if (buf != path)
      strcpy(buf,path);

#if defined(AMIGAOS)
    if (len>0 && buf[len-1]!='/' && buf[len-1]!=':')
      buf[len++] = '/';
    strcpy(buf+len,add);
    path = p = buf;
    while (*path) {
      if (*path == '.') {
        if (*(path+1) == '\0') {
          path++;
          continue;
        }
        else if (*(path+1)=='/') {
          path += 2;
          continue;
        }
        else if (*(path+1)=='.' && *(path+2)=='/')
          path += 2;
      }
      *p++ = *path++;
    }
    *p = '\0';

#elif defined(_WIN32)
    if (len>0 && buf[len-1]!='\\' && buf[len-1]!='/' && buf[len-1]!=':')
      buf[len++] = '\\';
    strcpy(buf+len,add);
    for (p=buf; *p; *p++) {
      if (*p == '/')
        *p = '\\';
    }

#else
    if (len>0 && buf[len-1]!='/')
      buf[len++] = '/';
    strcpy(buf+len,add);
#endif

    return buf;
  }

  return NULL;
}